

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

field<discordpp::WelcomeScreen> * __thiscall
discordpp::field<discordpp::WelcomeScreen>::operator=
          (field<discordpp::WelcomeScreen> *this,field<discordpp::WelcomeScreen> *f)

{
  bool bVar1;
  type pWVar2;
  pointer local_58;
  field<discordpp::WelcomeScreen> *f_local;
  field<discordpp::WelcomeScreen> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    local_58 = (pointer)operator_new(0x28);
    pWVar2 = std::
             unique_ptr<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_>::
             operator*(&f->t_);
    WelcomeScreen::WelcomeScreen(local_58,pWVar2);
  }
  else {
    local_58 = (pointer)0x0;
  }
  std::unique_ptr<discordpp::WelcomeScreen,_std::default_delete<discordpp::WelcomeScreen>_>::reset
            (&this->t_,local_58);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }